

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colTrie.c
# Opt level: O3

Col_Word Col_CopyTrieMap(Col_Word map)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Cell *pacVar4;
  
  pacVar4 = AllocCells(1);
  uVar1 = *(undefined8 *)(map + 8);
  uVar2 = *(undefined8 *)(map + 0x10);
  uVar3 = *(undefined8 *)(map + 0x18);
  *(undefined8 *)*pacVar4 = *(undefined8 *)map;
  *(undefined8 *)(*pacVar4 + 8) = uVar1;
  *(undefined8 *)(*pacVar4 + 0x10) = uVar2;
  *(undefined8 *)(*pacVar4 + 0x18) = uVar3;
  *(char *)((long)pacVar4 + 8) = '\0';
  *(char *)((long)pacVar4 + 9) = '\0';
  *(char *)((long)pacVar4 + 10) = '\0';
  *(char *)((long)pacVar4 + 0xb) = '\0';
  *(char *)((long)pacVar4 + 0xc) = '\0';
  *(char *)((long)pacVar4 + 0xd) = '\0';
  *(char *)((long)pacVar4 + 0xe) = '\0';
  *(char *)((long)pacVar4 + 0xf) = '\0';
  (*pacVar4)[0] = (*pacVar4)[0] & 0xfe;
  FreezeSubtrie(*(Col_Word *)(map + 0x18));
  return (Col_Word)pacVar4;
}

Assistant:

Col_Word
Col_CopyTrieMap(
    Col_Word map)   /*!< Trie map to copy. */
{
    Col_Word newMap;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_TRIEMAP,map} */
    TYPECHECK_TRIEMAP(map) return WORD_NIL;

    /*
     * Copy word first.
     */

    //TODO: provide custom data copy mechanism
    newMap = (Col_Word) AllocCells(1);
    memcpy((void *) newMap, (void *) map, sizeof(Cell));
    WORD_SYNONYM(newMap) = WORD_NIL;
    WORD_CLEAR_PINNED(newMap);

    /*
     * Freeze nodes recursively.
     */

    FreezeSubtrie(WORD_TRIEMAP_ROOT(map));

    /*
     * Both maps now share the same immutable structure.
     */

    return newMap;
}